

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

shared_ptr<mocker::ast::Identifier> __thiscall
mocker::Parser::identifier(Parser *this,TokIter *iter,TokIter end)

{
  Token *this_00;
  TokenID TVar1;
  Token *in_RCX;
  Token *extraout_RDX;
  shared_ptr<mocker::ast::Identifier> sVar3;
  Position beg;
  Position end_00;
  pair<mocker::Position,_mocker::Position> pos;
  size_t local_50;
  size_t local_48;
  size_t local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  TokIter TVar2;
  
  TVar2._M_current = end._M_current;
  if (*end._M_current != in_RCX) {
    TVar1 = Token::tokenID(*end._M_current);
    TVar2._M_current = extraout_RDX;
    if (TVar1 == Identifier) {
      Token::position(*end._M_current);
      this_00 = *end._M_current;
      *(Token **)end._M_current = this_00 + 1;
      Token::val<std::__cxx11::string>(this_00);
      beg.col = local_50;
      beg.line = (size_t)iter;
      end_00.col = local_40;
      end_00.line = local_48;
      sVar3 = makeNode<mocker::ast::Identifier,std::__cxx11::string_const&>
                        (this,beg,end_00,local_38);
      TVar2._M_current =
           (Token *)sVar3.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      goto LAB_0017fe51;
    }
  }
  (this->tokBeg)._M_current = (Token *)0x0;
  (this->tokEnd)._M_current = (Token *)0x0;
LAB_0017fe51:
  sVar3.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)TVar2._M_current;
  sVar3.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ast::Identifier>)
         sVar3.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ast::Identifier> Parser::identifier(TokIter &iter,
                                                    TokIter end) {
  if (GetTokenID(end)(iter) != TokenID::Identifier)
    return nullptr;
  auto pos = iter->position();
  return makeNode<ast::Identifier>(pos.first, pos.second,
                                   (iter++)->val<std::string>());
}